

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O0

void __thiscall C_matrix<double>::C_matrix(C_matrix<double> *this,int _L,int _C)

{
  double *pdVar1;
  double local_48;
  C_matrix<double> local_40;
  int local_18;
  int local_14;
  int _C_local;
  int _L_local;
  C_matrix<double> *this_local;
  
  this->_vptr_C_matrix = (_func_int **)&PTR__C_matrix_00125d60;
  this->m_L = _L;
  this->m_C = _C;
  local_18 = _C;
  local_14 = _L;
  __C_local = this;
  pdVar1 = allocate(this,this->m_L,this->m_C);
  this->m_A = pdVar1;
  if (this->m_A == (double *)0x0) {
    this->m_L = 0;
    this->m_C = 0;
  }
  this->endL = this->m_L + -1;
  this->endC = this->m_C + -1;
  local_48 = 0.0;
  operator=(&local_40,this,&local_48);
  ~C_matrix(&local_40);
  return;
}

Assistant:

C_matrix<dataType>::C_matrix(int _L, int _C) : m_L(_L),m_C(_C)
{
    m_A = allocate(m_L,m_C);
    if(m_A==NULL)
    {
        m_L=0;
        m_C=0;
    }
    endL = m_L-1;
    endC = m_C-1;
    *this = 0.0;
}